

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_start_accepting(nn_bws *self)

{
  nn_aws *pnVar1;
  nn_bws *self_local;
  
  if (self->aws != (nn_aws *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->aws == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/bws.c"
            ,0x181);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar1 = (nn_aws *)nn_alloc_(0x1b98);
  self->aws = pnVar1;
  if (self->aws == (nn_aws *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/bws.c"
            ,0x185);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_aws_init(self->aws,2,&self->epbase,&self->fsm);
  nn_aws_start(self->aws,&self->usock);
  return;
}

Assistant:

static void nn_bws_start_accepting (struct nn_bws *self)
{
    nn_assert (self->aws == NULL);

    /*  Allocate new aws state machine. */
    self->aws = nn_alloc (sizeof (struct nn_aws), "aws");
    alloc_assert (self->aws);
    nn_aws_init (self->aws, NN_BWS_SRC_AWS, &self->epbase, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_aws_start (self->aws, &self->usock);
}